

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

_Bool create_GL_context(SWindowData *window_data)

{
  byte *__haystack;
  SWindowData_X11 *window_data_x11;
  byte *pbVar1;
  _Bool _Var2;
  ulong in_RAX;
  long lVar3;
  byte *pbVar4;
  GLint minorGLX;
  GLint majorGLX;
  undefined8 local_28;
  
  window_data_x11 = (SWindowData_X11 *)window_data->specific;
  local_28 = in_RAX & 0xffffffff00000000;
  glXQueryVersion(window_data_x11->display,(long)&local_28 + 4);
  if ((local_28._4_4_ < 2) && ((int)local_28 < 2)) {
    create_GL_context_cold_1();
    return false;
  }
  _Var2 = setup_pixel_format(window_data_x11);
  if (!_Var2) {
    return false;
  }
  glXMakeCurrent(window_data_x11->display,window_data_x11->window,window_data_x11->context);
  init_GL(window_data);
  if (CheckGLExtension_extensions == (byte *)0x0) {
    lVar3 = glXGetCurrentDisplay();
    CheckGLExtension_extensions =
         (byte *)glXQueryExtensionsString(lVar3,*(undefined4 *)(lVar3 + 0xe0));
    if (CheckGLExtension_extensions == (byte *)0x0) goto LAB_00104183;
  }
  pbVar1 = CheckGLExtension_extensions;
  pbVar4 = (byte *)strstr((char *)CheckGLExtension_extensions,"GLX_EXT_swap_control");
  while( true ) {
    if (pbVar4 == (byte *)0x0) {
      return true;
    }
    __haystack = pbVar4 + 0x14;
    if (((pbVar4 == pbVar1) || (pbVar4[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) break;
    pbVar4 = (byte *)strstr((char *)__haystack,"GLX_EXT_swap_control");
    pbVar1 = __haystack;
  }
LAB_00104183:
  SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC)glXGetProcAddress("glXSwapIntervalEXT");
  set_target_fps_aux();
  return true;
}

Assistant:

bool
create_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)
    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;

    if (setup_pixel_format(window_data_win->hdc) == false)
        return false;

    window_data_win->hGLRC = wglCreateContext(window_data_win->hdc);
    wglMakeCurrent(window_data_win->hdc, window_data_win->hGLRC);
    init_GL(window_data);

    SwapIntervalEXT    = (PFNWGLSWAPINTERVALEXTPROC)    wglGetProcAddress("wglSwapIntervalEXT");
    GetSwapIntervalEXT = (PFNWGLGETSWAPINTERVALEXTPROC) wglGetProcAddress("wglGetSwapIntervalEXT");
    set_target_fps_aux();

    return true;

#elif defined(linux)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    GLint majorGLX, minorGLX = 0;
    glXQueryVersion(window_data_x11->display, &majorGLX, &minorGLX);
    if (majorGLX <= 1 && minorGLX < 2) {
        fprintf(stderr, "GLX 1.2 or greater is required.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    else {
        //fprintf(stdout, "GLX version: %d.%d\n", majorGLX, minorGLX);
    }

    if (setup_pixel_format(window_data_x11) == false)
        return false;

    glXMakeCurrent(window_data_x11->display, window_data_x11->window, window_data_x11->context);

    //fprintf(stdout, "GL Vendor: %s\n", glGetString(GL_VENDOR));
    //fprintf(stdout, "GL Renderer: %s\n", glGetString(GL_RENDERER));
    //fprintf(stdout, "GL Version: %s\n", glGetString(GL_VERSION));
    //fprintf(stdout, "GL Shading Language: %s\n", glGetString(GL_SHADING_LANGUAGE_VERSION));

    init_GL(window_data);

    if (CheckGLExtension("GLX_EXT_swap_control")) {
        SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC) glXGetProcAddress((const GLubyte *)"glXSwapIntervalEXT");
        set_target_fps_aux();
    }

    return true;
#endif
}